

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

nifti_image * nifti_simple_init_nim(void)

{
  nifti_image *pnVar1;
  long lVar2;
  undefined4 *puVar3;
  undefined1 *puVar4;
  byte bVar5;
  nifti_1_header in_stack_fffffffffffffd38;
  undefined4 local_168 [9];
  undefined1 local_142;
  undefined8 local_140;
  undefined4 local_122;
  undefined8 local_11c;
  undefined8 uStack_114;
  undefined4 local_10;
  
  bVar5 = 0;
  memset(local_168,0,0x158);
  local_168[0] = 0x15c;
  local_142 = 0x72;
  local_140 = 0x1000100010003;
  local_11c = 0x3f80000000000000;
  uStack_114 = 0x3f8000003f800000;
  local_122 = 0x200010;
  local_10 = 0x312b6e;
  puVar3 = local_168;
  puVar4 = &stack0xfffffffffffffd38;
  for (lVar2 = 0x15c; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined1 *)puVar3;
    puVar3 = (undefined4 *)((long)puVar3 + (ulong)bVar5 * -2 + 1);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  pnVar1 = nifti_convert_nhdr2nim(in_stack_fffffffffffffd38,(char *)0x0);
  pnVar1->fname = (char *)0x0;
  pnVar1->iname = (char *)0x0;
  return pnVar1;
}

Assistant:

nifti_image* nifti_simple_init_nim(void)
{
  nifti_image *nim;
  struct nifti_1_header nhdr;
  int nbyper, swapsize;

   memset(&nhdr,0,sizeof(nhdr)) ;  /* zero out header, to be safe */

   nhdr.sizeof_hdr = sizeof(nhdr) ;
   nhdr.regular    = 'r' ;           /* for some stupid reason */

   nhdr.dim[0] = 3 ;
   nhdr.dim[1] = 1 ; nhdr.dim[2] = 1 ; nhdr.dim[3] = 1 ;
   nhdr.dim[4] = 0 ;

   nhdr.pixdim[0] = 0.0f ;
   nhdr.pixdim[1] = 1.0f ; nhdr.pixdim[2] = 1.0f ;
   nhdr.pixdim[3] = 1.0f ;

   nhdr.datatype = DT_FLOAT32 ;
   nifti_datatype_sizes( nhdr.datatype , &nbyper, &swapsize );
   nhdr.bitpix   = 8 * nbyper ;

   strcpy(nhdr.magic, "n+1");  /* init to single file */

   nim = nifti_convert_nhdr2nim(nhdr,NULL);
   nim->fname = NULL;
   nim->iname = NULL;
   return nim;
}